

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O3

uint __thiscall llvm::APInt::countLeadingZerosSlowCase(APInt *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  
  uVar1 = this->BitWidth;
  if ((ulong)uVar1 == 0) {
    iVar4 = 0;
  }
  else {
    uVar5 = (int)((ulong)uVar1 + 0x3f >> 6) + 1;
    iVar4 = 0;
    do {
      uVar2 = (this->U).pVal[uVar5 - 2];
      if (uVar2 != 0) {
        lVar3 = 0x3f;
        if (uVar2 != 0) {
          for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        iVar4 = ((uint)lVar3 ^ 0x3f) + iVar4;
        break;
      }
      iVar4 = iVar4 + 0x40;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  uVar5 = uVar1 | 0xffffffc0;
  if ((uVar1 & 0x3f) == 0) {
    uVar5 = 0;
  }
  return uVar5 + iVar4;
}

Assistant:

unsigned getNumWords() const { return getNumWords(BitWidth); }